

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readTiled1.cpp
# Opt level: O0

void readTiled1(char *fileName,Array2D<GZ> *pixels,int *width,int *height)

{
  int iVar1;
  int iVar2;
  GZ *pGVar3;
  _Base_ptr in_RCX;
  int *in_RDX;
  Array2D<GZ> *in_RSI;
  char *in_RDI;
  FrameBuffer frameBuffer;
  int dy;
  int dx;
  Box2i dw;
  TiledInputFile in;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffea4;
  long in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  Slice local_108 [56];
  Slice local_d0 [56];
  char local_98 [52];
  int local_64;
  int local_60;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  FrameBuffer local_40;
  Array2D<GZ> *local_10;
  
  local_40._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = in_RCX;
  local_40._map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)in_RDX;
  local_10 = in_RSI;
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&local_40,in_RDI,iVar1);
  Imf_3_4::TiledInputFile::header();
  Imf_3_4::Header::dataWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  *(int *)local_40._map._M_t._M_impl.super__Rb_tree_header._M_node_count = (local_48 - local_50) + 1
  ;
  (local_40._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right)->_M_color =
       (local_44 - local_4c) + _S_black;
  local_60 = local_50;
  local_64 = local_4c;
  Imf_3_4::Array2D<GZ>::resizeErase
            ((Array2D<GZ> *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),in_stack_fffffffffffffeb0
            );
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x10955c);
  pGVar3 = Imf_3_4::Array2D<GZ>::operator[](local_10,(long)-local_64);
  Imf_3_4::Slice::Slice
            (local_d0,HALF,(char *)(pGVar3 + -local_60),8,
             (long)*(int *)local_40._map._M_t._M_impl.super__Rb_tree_header._M_node_count << 3,1,1,
             0.0,false,false);
  Imf_3_4::FrameBuffer::insert(local_98,(Slice *)"G");
  pGVar3 = Imf_3_4::Array2D<GZ>::operator[](local_10,(long)-local_64);
  uVar4 = 0;
  Imf_3_4::Slice::Slice
            (local_108,FLOAT,(char *)&pGVar3[-local_60].z,8,
             (long)*(int *)local_40._map._M_t._M_impl.super__Rb_tree_header._M_node_count << 3,1,1,
             0.0,false,false);
  Imf_3_4::FrameBuffer::insert(local_98,(Slice *)0x1100cc);
  Imf_3_4::TiledInputFile::setFrameBuffer(&local_40);
  iVar1 = Imf_3_4::TiledInputFile::numXTiles((int)&local_40);
  iVar1 = iVar1 + -1;
  iVar2 = Imf_3_4::TiledInputFile::numYTiles((int)&local_40);
  Imf_3_4::TiledInputFile::readTiles((int)&local_40,0,iVar1,0,iVar2 + -1);
  Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x109707);
  Imf_3_4::TiledInputFile::~TiledInputFile
            ((TiledInputFile *)CONCAT44(in_stack_fffffffffffffea4,uVar4));
  return;
}

Assistant:

void
readTiled1 (const char fileName[], Array2D<GZ>& pixels, int& width, int& height)
{
    TiledInputFile in (fileName);

    Box2i dw = in.header ().dataWindow ();
    width    = dw.max.x - dw.min.x + 1;
    height   = dw.max.y - dw.min.y + 1;

    int dx = dw.min.x;
    int dy = dw.min.y;

    pixels.resizeErase (height, width);

    FrameBuffer frameBuffer;

    frameBuffer.insert (
        "G",
        Slice (
            HALF,
            (char*) &pixels[-dy][-dx].g,
            sizeof (pixels[0][0]) * 1,
            sizeof (pixels[0][0]) * width));

    frameBuffer.insert (
        "Z",
        Slice (
            FLOAT,
            (char*) &pixels[-dy][-dx].z,
            sizeof (pixels[0][0]) * 1,
            sizeof (pixels[0][0]) * width));

    in.setFrameBuffer (frameBuffer);
    in.readTiles (0, in.numXTiles () - 1, 0, in.numYTiles () - 1);
}